

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O0

void testHuf(string *param_1)

{
  ostream *poVar1;
  unsigned_short *puVar2;
  unsigned_short *puVar3;
  unsigned_short *puVar4;
  unsigned_short *data;
  unsigned_short *puVar5;
  exception *e;
  Array<unsigned_short> raw;
  int N;
  Rand48 rand48;
  unsigned_long in_stack_fffffffffffffde8;
  Array<unsigned_short> *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  Rand48 *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  unsigned_short *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe78;
  unsigned_short *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe98;
  int iVar6;
  unsigned_short *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  int iVar7;
  unsigned_short *in_stack_fffffffffffffeb0;
  Array local_30 [16];
  undefined4 local_20;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  iVar7 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing Huffman encoder");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Rand48::Rand48((Rand48 *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  local_20 = 1000000;
  Imf_2_5::Array<unsigned_short>::Array(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill1
            (in_stack_fffffffffffffe00->_state,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
             (float)in_stack_fffffffffffffdf8,(Rand48 *)in_stack_fffffffffffffdf0);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(in_stack_fffffffffffffea0,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(in_stack_fffffffffffffeb0,iVar7);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill1
            (in_stack_fffffffffffffe00->_state,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
             (float)in_stack_fffffffffffffdf8,(Rand48 *)in_stack_fffffffffffffdf0);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(in_stack_fffffffffffffea0,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(in_stack_fffffffffffffeb0,iVar7);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill1
            (in_stack_fffffffffffffe00->_state,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
             (float)in_stack_fffffffffffffdf8,(Rand48 *)in_stack_fffffffffffffdf0);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(in_stack_fffffffffffffea0,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(in_stack_fffffffffffffeb0,iVar7);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill1
            (in_stack_fffffffffffffe00->_state,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
             (float)in_stack_fffffffffffffdf8,(Rand48 *)in_stack_fffffffffffffdf0);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(in_stack_fffffffffffffea0,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(in_stack_fffffffffffffeb0,iVar7);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill2
            (in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
             (int)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(in_stack_fffffffffffffea0,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(in_stack_fffffffffffffeb0,iVar7);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill2
            (in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
             (int)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(in_stack_fffffffffffffea0,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(in_stack_fffffffffffffeb0,iVar7);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill2
            (in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
             (int)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(in_stack_fffffffffffffea0,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(in_stack_fffffffffffffeb0,iVar7);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill2
            (in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
             (int)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(in_stack_fffffffffffffea0,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(in_stack_fffffffffffffeb0,iVar7);
  puVar2 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill3(puVar2,1000000,0);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(in_stack_fffffffffffffea0,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(in_stack_fffffffffffffeb0,iVar7);
  puVar2 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill3(puVar2,1000000,1);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(in_stack_fffffffffffffea0,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(in_stack_fffffffffffffeb0,iVar7);
  puVar2 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill3(puVar2,1000000,0xfffe);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(in_stack_fffffffffffffea0,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(in_stack_fffffffffffffeb0,iVar7);
  puVar2 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill3(puVar2,1000000,0xffff);
  puVar3 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  iVar7 = (int)((ulong)puVar3 >> 0x20);
  anon_unknown.dwarf_fff93::compressUncompress(in_stack_fffffffffffffea0,iVar6);
  puVar3 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(puVar2,iVar7);
  puVar4 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill4(puVar4,0x10000);
  iVar6 = (int)((ulong)puVar4 >> 0x20);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressVerify
            (in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (uint)in_stack_fffffffffffffe78);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(puVar3,iVar6);
  puVar4 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(puVar2,iVar7);
  data = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill4(data,1000000);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressVerify(puVar4,(int)((ulong)data >> 0x20),(uint)data);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(puVar3,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(puVar2,iVar7);
  puVar5 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill4(puVar5,0);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(puVar3,iVar6);
  puVar5 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill4(puVar5,1);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(puVar3,iVar6);
  puVar5 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill4(puVar5,2);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(puVar3,iVar6);
  puVar5 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill4(puVar5,3);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(puVar3,iVar6);
  puVar5 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::fill5(puVar5,1000000);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressVerify(puVar4,(int)((ulong)data >> 0x20),(uint)data);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompress(puVar3,iVar6);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  anon_unknown.dwarf_fff93::compressUncompressSubset(puVar2,iVar7);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_2_5::Array<unsigned_short>::~Array(in_stack_fffffffffffffdf0);
  return;
}

Assistant:

void
testHuf (const std::string&)
{
    try
    {
	cout << "Testing Huffman encoder" << endl;

	IMATH_NAMESPACE::Rand48 rand48 (0);

	const int N = 1000000;
	Array <unsigned short> raw (N);

	fill1 (raw, N, 1, rand48);	  // test various symbol distributions
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill1 (raw, N, 10, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill1 (raw, N, 100, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill1 (raw, N, 1000, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);

	fill2 (raw, N, 1, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill2 (raw, N, 10, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill2 (raw, N, 100, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill2 (raw, N, 1000, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);

	fill3 (raw, N, 0);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill3 (raw, N, 1);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill3 (raw, N, USHRT_MAX - 1);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill3 (raw, N, USHRT_MAX);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);

	fill4 (raw, USHRT_MAX + 1);
        compressVerify(raw, USHRT_MAX + 1, HUF_COMPRESS_DEK_HASH_FOR_FILL4_USHRT_MAX_PLUS_ONE);
	compressUncompress (raw, USHRT_MAX + 1);
	compressUncompressSubset (raw, USHRT_MAX + 1);
	fill4 (raw, N);
        compressVerify(raw, N, HUF_COMPRESS_DEK_HASH_FOR_FILL4_N);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);

	fill4 (raw, 0);
	compressUncompress (raw, 0);	// test small input data sets
	fill4 (raw, 1);
	compressUncompress (raw, 1);
	fill4 (raw, 2);
	compressUncompress (raw, 2);
	fill4 (raw, 3);
	compressUncompress (raw, 3);

	fill5 (raw, N);			// test run-length coding of code table
        compressVerify(raw, N, HUF_COMPRESS_DEK_HASH_FOR_FILL5_N);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}